

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O3

string_t duckdb::StringCastTZ::Operation<duckdb::dtime_tz_t>(dtime_tz_t input,Vector *vector)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  idx_t length;
  Vector *pVVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  uint uVar9;
  Vector *vector_00;
  byte bVar10;
  char cVar11;
  uint uVar12;
  char *data;
  long lVar13;
  char *pcVar14;
  string_t sVar15;
  int32_t time [4];
  string_t result;
  char micro_buffer [10];
  int32_t local_88;
  int32_t local_84;
  int32_t local_80;
  int32_t local_7c [3];
  Vector *local_70;
  undefined1 local_68 [16];
  Vector *local_58;
  long local_50;
  Vector *local_48;
  char local_40 [16];
  
  local_48 = vector;
  Time::Convert((dtime_t)(input.bits >> 0x18),&local_88,&local_84,&local_80,local_7c);
  local_40[8] = '\0';
  local_40[9] = '\0';
  local_40[0] = '\0';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  length = TimeToStringCast::MicrosLength(local_7c[0],local_40);
  uVar12 = (uint)input.bits & 0xffffff;
  uVar3 = 0xe0ff - uVar12;
  lVar13 = length + 1;
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar3 = (uint)((ulong)uVar1 * 0x48d159f >> 0x20);
  uVar7 = uVar3 >> 6;
  uVar9 = uVar1 + uVar7 * -0xe10;
  local_50 = 2;
  if (359999 < uVar1) {
    iVar4 = NumericHelper::UnsignedLength<unsigned_int>(uVar7);
    local_50 = (long)iVar4;
  }
  local_70 = (Vector *)(local_50 + lVar13);
  local_58 = (Vector *)(local_50 + 3 + lVar13);
  pVVar5 = local_58;
  if (uVar9 < 0x3c) {
    pVVar5 = local_70;
  }
  uVar7 = (uVar9 & 0xffff) / 0x3c;
  uVar2 = (ushort)uVar7;
  uVar8 = (short)uVar9 + uVar2 * -0x3c;
  vector_00 = (Vector *)&pVVar5->field_0x3;
  if (uVar8 == 0) {
    vector_00 = pVVar5;
  }
  local_68 = (undefined1  [16])
             StringVector::EmptyString((StringVector *)local_48,vector_00,(ulong)(uint)uVar8);
  data = local_68._8_8_;
  if (local_68._0_4_ < 0xd) {
    data = local_68 + 4;
  }
  TimeToStringCast::Format(data,length,local_88,local_84,local_80,local_7c[0],local_40);
  pcVar14 = data + lVar13;
  data[length] = (0xe0ff < uVar12) * '\x02' + '+';
  uVar3 = uVar3 >> 6;
  if (uVar1 < 360000) {
    if (uVar1 < 36000) {
      *pcVar14 = '0';
      cVar11 = (char)((ulong)uVar1 * 0x48d159f >> 0x26) + '0';
    }
    else {
      cVar11 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)uVar3 * 2 + 1];
      *pcVar14 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)uVar3 * 2];
    }
    pcVar14[1] = cVar11;
  }
  else {
    NumericHelper::FormatUnsigned<int>(uVar3,pcVar14 + local_50);
  }
  pVVar5 = local_70;
  if (0x3b < uVar9) {
    data[(long)local_70] = ':';
    if (uVar9 < 600) {
      (data + 1)[(long)local_70] = '0';
      cVar11 = (char)uVar7 + '0';
    }
    else {
      cVar11 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)uVar2 * 2 + 1];
      (data + 1)[(long)local_70] =
           duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)uVar2 * 2];
    }
    pVVar5 = local_58;
    (data + 2)[(long)local_70] = cVar11;
  }
  if (uVar8 != 0) {
    data[(long)pVVar5] = ':';
    if (uVar8 < 10) {
      (data + 1)[(long)pVVar5] = '0';
      bVar10 = (byte)uVar8 | 0x30;
    }
    else {
      uVar1 = (uint)uVar8 * 2;
      (data + 1)[(long)pVVar5] = duckdb_fmt::v6::internal::basic_data<void>::digits[uVar1];
      bVar10 = duckdb_fmt::v6::internal::basic_data<void>::digits[(ulong)(ushort)uVar1 + 1];
    }
    (data + 2)[(long)pVVar5] = bVar10;
  }
  uVar6 = (ulong)(uint)local_68._0_4_;
  if (uVar6 < 0xd) {
    switchD_010444a0::default(local_68 + uVar6 + 4,0,0xc - uVar6);
  }
  else {
    local_68._4_4_ = *(undefined4 *)local_68._8_8_;
  }
  sVar15.value.pointer.ptr = (char *)local_68._8_8_;
  sVar15.value._0_8_ = local_68._0_8_;
  return (string_t)sVar15.value;
}

Assistant:

string_t StringCastTZ::Operation(dtime_tz_t input, Vector &vector) {
	int32_t time[4];
	Time::Convert(input.time(), time[0], time[1], time[2], time[3]);

	char micro_buffer[10] = {};
	const auto time_length = TimeToStringCast::Length(time, micro_buffer);
	idx_t length = time_length;

	const auto offset = input.offset();
	const bool negative = (offset < 0);
	++length;

	auto ss = std::abs(offset);
	const auto hh = ss / Interval::SECS_PER_HOUR;

	const auto hh_length = UnsafeNumericCast<idx_t>((hh < 100) ? 2 : NumericHelper::UnsignedLength(uint32_t(hh)));
	length += hh_length;

	ss %= Interval::SECS_PER_HOUR;
	const auto mm = ss / Interval::SECS_PER_MINUTE;
	if (mm) {
		length += 3;
	}

	ss %= Interval::SECS_PER_MINUTE;
	if (ss) {
		length += 3;
	}

	string_t result = StringVector::EmptyString(vector, length);
	auto data = result.GetDataWriteable();

	idx_t pos = 0;
	TimeToStringCast::Format(data + pos, time_length, time, micro_buffer);
	pos += time_length;

	data[pos++] = negative ? '-' : '+';
	if (hh < 100) {
		TimeToStringCast::FormatTwoDigits(data + pos, hh);
	} else {
		NumericHelper::FormatUnsigned(hh, data + pos + hh_length);
	}
	pos += hh_length;

	if (mm) {
		data[pos++] = ':';
		TimeToStringCast::FormatTwoDigits(data + pos, mm);
		pos += 2;
	}

	if (ss) {
		data[pos++] = ':';
		TimeToStringCast::FormatTwoDigits(data + pos, ss);
		pos += 2;
	}

	result.Finalize();
	return result;
}